

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::mask_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          uint64_t r,uint64_t g,uint64_t b)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint64_t _a;
  uint64_t _b;
  uint64_t _g;
  uint64_t _r;
  long local_80;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  lVar10 = source->width;
  if (w < 0) {
    w = lVar10;
  }
  lVar1 = source->height;
  if (h < 0) {
    h = lVar1;
  }
  uVar7 = sx >> 0x3f & sx;
  lVar3 = x - uVar7;
  lVar4 = 0;
  if (sx < 1) {
    sx = lVar4;
  }
  uVar8 = sy >> 0x3f & sy;
  lVar2 = y - uVar8;
  if (sy < 1) {
    sy = lVar4;
  }
  lVar5 = 0;
  if (0 < lVar3) {
    lVar5 = lVar3;
  }
  if (-1 < lVar3) {
    lVar3 = lVar4;
  }
  uVar7 = uVar7 + w + lVar3;
  lVar3 = sx - lVar3;
  lVar6 = 0;
  if (0 < lVar2) {
    lVar6 = lVar2;
  }
  if (-1 < lVar2) {
    lVar2 = lVar4;
  }
  uVar9 = uVar8 + h + lVar2;
  lVar2 = sy - lVar2;
  uVar8 = lVar10 - lVar3;
  if ((long)(uVar7 + lVar3) <= lVar10) {
    uVar8 = uVar7;
  }
  uVar7 = lVar1 - lVar2;
  if ((long)(uVar9 + lVar2) <= lVar1) {
    uVar7 = uVar9;
  }
  uVar9 = this->width - lVar5;
  if ((long)(uVar8 + lVar5) <= this->width) {
    uVar9 = uVar8;
  }
  uVar8 = this->height - lVar6;
  if ((long)(uVar7 + lVar6) <= this->height) {
    uVar8 = uVar7;
  }
  if (0 < (long)uVar8 && -1 < (long)(uVar8 | uVar9)) {
    local_80 = 0;
    do {
      if (0 < (long)uVar9) {
        lVar10 = 0;
        do {
          read_pixel(source,lVar3 + lVar10,local_80 + lVar2,&local_38,&local_40,&local_48,&local_50)
          ;
          if (local_48 != b || (local_40 != g || local_38 != r)) {
            write_pixel(this,lVar5 + lVar10,local_80 + lVar6,local_38,local_40,local_48,local_50);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (long)uVar9);
      }
      local_80 = local_80 + 1;
    } while (local_80 < (long)uVar8);
  }
  return;
}

Assistant:

void Image::mask_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, uint64_t r, uint64_t g, uint64_t b) {

  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t _r, _g, _b, _a;
      source.read_pixel(sx + xx, sy + yy, &_r, &_g, &_b, &_a);
      if (r != _r || g != _g || b != _b) {
        this->write_pixel(x + xx, y + yy, _r, _g, _b, _a);
      }
    }
  }
}